

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
dynet::PickElement::forward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint lindex;
  Tensor *pTVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  pointer puVar10;
  ostream *poVar11;
  pointer ppTVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  
  if (this->pval != (uint *)0x0) {
    lindex = *this->pval;
    pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (lindex < (pTVar1->d).d[0]) {
      TensorTools::CopyElement(pTVar1,lindex,fx,0);
      return;
    }
    poVar11 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,*this->pval);
    poVar11 = std::operator<<(poVar11," from a vector of length ");
    ppTVar12 = (xs->
               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
LAB_00350bfa:
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,((*ppTVar12)->d).d[0]);
    std::endl<char,std::char_traits<char>>(poVar11);
    abort();
  }
  pvVar2 = this->pvals;
  if (pvVar2 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("pvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x546,
                  "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  puVar10 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar3 - (long)puVar10 >> 2 != (ulong)(fx->d).bd) {
    __assert_fail("pvals->size() == fx.d.batch_elems()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x547,
                  "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (ulong)(pTVar1->d).nd;
  if (uVar13 == 0) {
    iVar24 = 1;
  }
  else {
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f();
    uVar14 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar18);
      auVar18 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar18,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar16 = CONCAT11(bVar9,bVar8);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar14));
      auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar9 >> 7) * auVar18._60_4_;
      uVar14 = uVar14 + 0x10;
      auVar18 = vpmulld_avx512f(auVar22,auVar23);
    } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar14);
    auVar18 = vmovdqa32_avx512f(auVar18);
    auVar19._0_4_ = (uint)(bVar8 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar4 * auVar18._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar4 * auVar18._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar4 * auVar18._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar4 * auVar18._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar4 * auVar18._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar4 * auVar18._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar4 * auVar18._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar19._32_4_ = (uint)(bVar9 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar4 * auVar18._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar4 * auVar18._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar4 * auVar18._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar4 * auVar18._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar4 * auVar18._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar4 * auVar18._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar19._60_4_ =
         (uint)(bVar9 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar17));
    auVar5 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar24 = auVar5._0_4_;
  }
  if (puVar3 != puVar10) {
    iVar15 = 0;
    uVar13 = 0;
    do {
      pTVar1 = *(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->d).d[0] <= puVar10[uVar13]) {
        poVar11 = std::operator<<((ostream *)&std::cerr,
                                  "PickElement::forward_impl requested element ");
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,(this->pvals->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar13]);
        poVar11 = std::operator<<(poVar11," from a vector of length ");
        ppTVar12 = (xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00350bfa;
      }
      TensorTools::CopyElement(pTVar1,puVar10[uVar13] + iVar15,fx,(int)uVar13);
      uVar13 = (ulong)((int)uVar13 + 1);
      iVar15 = iVar15 + iVar24;
      puVar10 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->pvals->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 2)
            );
  }
  return;
}

Assistant:

void PickElement::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << " from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    TensorTools::CopyElement(*xs[0], *pval, fx, 0);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    int batch_size = xs[0]->d.batch_size();
    for(unsigned b = 0; b < pvals->size(); ++b) {
      if ((*pvals)[b] >= xs[0]->d.rows()) {
        cerr << "PickElement::forward_impl requested element " << (*pvals)[b]
             << " from a vector of length " << xs[0]->d.rows() << endl;
        abort();
      }
      TensorTools::CopyElement(*xs[0], b*batch_size + (*pvals)[b], fx, b);
    }
  }
}